

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

char * BuildModuleFromPath(Allocator *allocator,InplaceStr moduleName,char *moduleRoot,
                          bool addExtension,char **errorPos,char *errorBuf,uint errorBufSize,
                          int optimizationLevel,ArrayView<InplaceStr> activeImports,
                          CompilerStatistics *statistics)

{
  InplaceStr moduleName_00;
  InplaceStr moduleName_01;
  uint uVar1;
  int iVar2;
  char *pcVar3;
  char *bytecode;
  int local_8d0;
  char *pos_1;
  int local_8b0;
  char *pos;
  char *local_898;
  char *fileContent;
  char local_888 [4];
  uint fileSize;
  char path [1024];
  char **ppcStack_480;
  uint pathLength;
  char *nextModuleRoot;
  char nextModuleRootBuf [1024];
  undefined1 local_68 [4];
  uint nextModuleRootLength;
  TraceScope traceScope;
  char **errorPos_local;
  bool addExtension_local;
  char *moduleRoot_local;
  Allocator *allocator_local;
  InplaceStr moduleName_local;
  
  moduleName_local.begin = moduleName.end;
  allocator_local = (Allocator *)moduleName.begin;
  if (statistics != (CompilerStatistics *)0x0) {
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Start(statistics,uVar1);
  }
  NULLC::TraceDump();
  if (statistics != (CompilerStatistics *)0x0) {
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Tracing",uVar1);
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Start(statistics,uVar1);
  }
  if ((BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
       ::token == '\0') &&
     (iVar2 = __cxa_guard_acquire(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                                   ::token), iVar2 != 0)) {
    BuildModuleFromPath::token = NULLC::TraceGetToken("compiler","BuildModuleFromPath");
    __cxa_guard_release(&BuildModuleFromPath(Allocator*,InplaceStr,char_const*,bool,char_const**,char*,unsigned_int,int,ArrayView<InplaceStr>,CompilerStatistics*)
                         ::token);
  }
  NULLC::TraceScope::TraceScope((TraceScope *)local_68,BuildModuleFromPath::token);
  NULLC::TraceLabel((char *)allocator_local,moduleName_local.begin);
  if (*moduleName_local.begin != '\0') {
    __assert_fail("*moduleName.end == 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                  ,0x882,
                  "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                 );
  }
  if (addExtension) {
    pcVar3 = strstr((char *)allocator_local,".nc");
    if (pcVar3 != (char *)0x0) {
      __assert_fail("strstr(moduleName.begin, \".nc\") == NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x885,
                    "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                   );
    }
  }
  else {
    pcVar3 = strstr((char *)allocator_local,".nc");
    if (pcVar3 == (char *)0x0) {
      __assert_fail("strstr(moduleName.begin, \".nc\") != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Compiler.cpp"
                    ,0x887,
                    "char *BuildModuleFromPath(Allocator *, InplaceStr, const char *, bool, const char **, char *, unsigned int, int, ArrayView<InplaceStr>, CompilerStatistics *)"
                   );
    }
  }
  path[0x3fc] = '\0';
  path[0x3fd] = '\x04';
  path[0x3fe] = '\0';
  path[0x3ff] = '\0';
  fileContent._4_4_ = 0;
  local_898 = (char *)0x0;
  ppcStack_480 = (char **)moduleRoot;
  if (((moduleRoot != (char *)0x0) &&
      (moduleName_01.end = moduleName_local.begin, moduleName_01.begin = (char *)allocator_local,
      local_898 = FindFileContentInImportPaths
                            (moduleName_01,moduleRoot,addExtension,local_888,0x400,
                             (uint *)((long)&fileContent + 4)), local_898 != (char *)0x0)) &&
     (pcVar3 = InplaceStr::rfind((InplaceStr *)&allocator_local,'/'), pcVar3 != (char *)0x0)) {
    local_8b0 = (int)pcVar3;
    NULLC::SafeSprintf((char *)&nextModuleRoot,0x400,"%s/%.*s",moduleRoot,
                       (ulong)(uint)(local_8b0 - (int)allocator_local));
    ppcStack_480 = &nextModuleRoot;
  }
  if (((local_898 == (char *)0x0) &&
      (moduleName_00.end = moduleName_local.begin, moduleName_00.begin = (char *)allocator_local,
      local_898 = FindFileContentInImportPaths
                            (moduleName_00,(char *)0x0,addExtension,local_888,0x400,
                             (uint *)((long)&fileContent + 4)), local_898 != (char *)0x0)) &&
     (pcVar3 = InplaceStr::rfind((InplaceStr *)&allocator_local,'/'), pcVar3 != (char *)0x0)) {
    local_8d0 = (int)pcVar3;
    NULLC::SafeSprintf((char *)&nextModuleRoot,0x400,"%.*s",
                       (ulong)(uint)(local_8d0 - (int)allocator_local));
    ppcStack_480 = &nextModuleRoot;
  }
  if (statistics != (CompilerStatistics *)0x0) {
    uVar1 = NULLCTime::clockMicro();
    CompilerStatistics::Finish(statistics,"Extra",uVar1);
  }
  if (local_898 == (char *)0x0) {
    *errorPos = (char *)0x0;
    if ((errorBuf != (char *)0x0) && (errorBufSize != 0)) {
      uVar1 = InplaceStr::length((InplaceStr *)&allocator_local);
      NULLC::SafeSprintf(errorBuf,(ulong)errorBufSize,
                         "ERROR: module file \'%.*s\' could not be opened",(ulong)uVar1,
                         allocator_local);
    }
    moduleName_local.end = (char *)0x0;
  }
  else {
    pcVar3 = BuildModuleFromSource
                       (allocator,local_888,(char *)ppcStack_480,local_898,fileContent._4_4_,
                        errorPos,errorBuf,errorBufSize,optimizationLevel,activeImports,statistics);
    (*(code *)NULLC::fileFree)(local_898);
    moduleName_local.end = pcVar3;
  }
  NULLC::TraceScope::~TraceScope((TraceScope *)local_68);
  return moduleName_local.end;
}

Assistant:

char* BuildModuleFromPath(Allocator *allocator, InplaceStr moduleName, const char *moduleRoot, bool addExtension, const char **errorPos, char *errorBuf, unsigned errorBufSize, int optimizationLevel, ArrayView<InplaceStr> activeImports, CompilerStatistics *statistics)
{
	if(statistics)
		statistics->Start(NULLCTime::clockMicro());

	NULLC::TraceDump();

	if(statistics)
	{
		statistics->Finish("Tracing", NULLCTime::clockMicro());
		statistics->Start(NULLCTime::clockMicro());
	}

	TRACE_SCOPE("compiler", "BuildModuleFromPath");
	TRACE_LABEL2(moduleName.begin, moduleName.end);

	assert(*moduleName.end == 0);

	if(addExtension)
		assert(strstr(moduleName.begin, ".nc") == NULL);
	else
		assert(strstr(moduleName.begin, ".nc") != NULL);

	const unsigned nextModuleRootLength = 1024;
	char nextModuleRootBuf[nextModuleRootLength];

	const char *nextModuleRoot = moduleRoot;

	const unsigned pathLength = 1024;
	char path[pathLength];

	unsigned fileSize = 0;
	const char *fileContent = NULL;

	if(moduleRoot)
	{
		fileContent = FindFileContentInImportPaths(moduleName, moduleRoot, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%s/%.*s", moduleRoot, unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(!fileContent)
	{
		fileContent = FindFileContentInImportPaths(moduleName, NULL, addExtension, path, pathLength, fileSize);

		if(fileContent)
		{
			if(const char *pos = moduleName.rfind('/'))
			{
				NULLC::SafeSprintf(nextModuleRootBuf, nextModuleRootLength, "%.*s", unsigned(pos - moduleName.begin), moduleName.begin);

				nextModuleRoot = nextModuleRootBuf;
			}
		}
	}

	if(statistics)
		statistics->Finish("Extra", NULLCTime::clockMicro());

	if(!fileContent)
	{
		*errorPos = NULL;

		if(errorBuf && errorBufSize)
			NULLC::SafeSprintf(errorBuf, errorBufSize, "ERROR: module file '%.*s' could not be opened", moduleName.length(), moduleName.begin);

		return NULL;
	}

	char *bytecode = BuildModuleFromSource(allocator, path, nextModuleRoot, fileContent, fileSize, errorPos, errorBuf, errorBufSize, optimizationLevel, activeImports, statistics);

	NULLC::fileFree(fileContent);

	return bytecode;
}